

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

int Sfm_DecExtract(Abc_Ntk_t *pNtk,Sfm_Par_t *pPars,Abc_Obj_t *pPivot,Vec_Int_t *vRoots,
                  Vec_Int_t *vGates,Vec_Wec_t *vFanins,Vec_Int_t *vMap,Vec_Int_t *vTfi,
                  Vec_Int_t *vTfo,Vec_Int_t *vMffc,Vec_Int_t *vInMffc,Sfm_Tim_t *pTim,
                  Sfm_Mit_t *pMit)

{
  long *plVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  if ((*(uint *)&pPivot->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x61c,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  uVar13 = *(uint *)&pPivot->field_0x14 >> 0xc;
  iVar6 = pPars->nTfoLevMax;
  iVar14 = uVar13 - pPars->nTfiLevMax;
  vTfo->nSize = 0;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar16 = pNtk->vObjs->nSize;
    uVar9 = (long)iVar16 + 500;
    iVar15 = (int)uVar9;
    if ((pNtk->vTravIds).nCap < iVar15) {
      piVar7 = (int *)malloc(uVar9 * 4);
      (pNtk->vTravIds).pArray = piVar7;
      if (piVar7 == (int *)0x0) goto LAB_004b4ddd;
      (pNtk->vTravIds).nCap = iVar15;
    }
    if (-500 < iVar16) {
      memset((pNtk->vTravIds).pArray,0,(uVar9 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar15;
  }
  iVar16 = pNtk->nTravIds;
  pNtk->nTravIds = iVar16 + 1;
  if (iVar16 < 0x3fffffff) {
    Abc_NtkDfsReverseOne_rec(pPivot,vTfo,iVar6 + uVar13,pPars->nFanoutMax);
    if (0 < vTfo->nSize) {
      lVar8 = 0;
      do {
        iVar6 = vTfo->pArray[lVar8];
        if (((long)iVar6 < 0) || (pNtk->vObjs->nSize <= iVar6)) goto LAB_004b4ca7;
        plVar1 = (long *)pNtk->vObjs->pArray[iVar6];
        if ((plVar1 != (long *)0x0) && (0 < *(int *)((long)plVar1 + 0x1c))) {
          lVar12 = 0;
          do {
            piVar7 = (int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                      (long)*(int *)(plVar1[4] + lVar12 * 4) * 8) + 0x40);
            *piVar7 = *piVar7 + 1;
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)plVar1 + 0x1c));
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vTfo->nSize);
    }
    vRoots->nSize = 0;
    if (0 < vTfo->nSize) {
      lVar8 = 0;
      do {
        iVar6 = vTfo->pArray[lVar8];
        if (((long)iVar6 < 0) || (pNtk->vObjs->nSize <= iVar6)) goto LAB_004b4ca7;
        pvVar2 = pNtk->vObjs->pArray[iVar6];
        if ((pvVar2 != (void *)0x0) &&
           (*(int *)((long)pvVar2 + 0x40) != *(int *)((long)pvVar2 + 0x2c))) {
          Vec_IntPush(vRoots,*(int *)((long)pvVar2 + 0x10));
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vTfo->nSize);
    }
    if (vRoots->nSize < 1) {
      __assert_fail("Vec_IntSize(vRoots) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                    ,0x62c,
                    "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                   );
    }
    vTfi->nSize = 0;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar6 = pNtk->vObjs->nSize;
      uVar9 = (long)iVar6 + 500;
      iVar16 = (int)uVar9;
      if ((pNtk->vTravIds).nCap < iVar16) {
        piVar7 = (int *)malloc(uVar9 * 4);
        (pNtk->vTravIds).pArray = piVar7;
        if (piVar7 == (int *)0x0) {
LAB_004b4ddd:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar16;
      }
      if (-500 < iVar6) {
        memset((pNtk->vTravIds).pArray,0,(uVar9 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar16;
    }
    iVar6 = pNtk->nTravIds;
    pNtk->nTravIds = iVar6 + 1;
    if (iVar6 < 0x3fffffff) {
      Abc_NtkDfsOne_rec(pPivot,vTfi,iVar14,1);
      uVar13 = vTfi->nSize;
      uVar9 = (ulong)uVar13;
      plVar1 = (long *)pPivot->pNtk->pData;
      lVar8 = *plVar1;
      if (*(int *)(lVar8 + 0x58) != 0) {
        iVar6 = pPivot->Id;
        lVar8 = (long)iVar6;
        if ((lVar8 < 0) || (*(int *)((long)plVar1 + 0x144) <= iVar6)) {
LAB_004b4ce5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        if (*(int *)((long)plVar1 + 0x154) <= iVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        *(ulong *)(plVar1[0x2b] + lVar8 * 8) = ~*(ulong *)(plVar1[0x29] + lVar8 * 8);
      }
      Sfm_DecMarkMffc(pPivot,iVar14,pPars->nMffcMax,(int)lVar8,vMffc,vInMffc,pTim,pMit);
      if (pPars->nMffcMax < vMffc->nSize) {
        __assert_fail("Vec_IntSize(vMffc) <= pPars->nMffcMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x635,
                      "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                     );
      }
      if (0 < vRoots->nSize) {
        lVar8 = 0;
        do {
          iVar6 = vRoots->pArray[lVar8];
          if (((long)iVar6 < 0) || (pNtk->vObjs->nSize <= iVar6)) goto LAB_004b4ca7;
          pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar6];
          if (pAVar3 != (Abc_Obj_t *)0x0) {
            Abc_NtkDfsOne_rec(pAVar3,vTfi,iVar14,2);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vRoots->nSize);
      }
      if ((int)uVar13 < vTfi->nSize) {
        do {
          if ((int)uVar13 < 0) goto LAB_004b4cc6;
          iVar6 = vTfi->pArray[uVar9];
          if (((long)iVar6 < 0) || (pNtk->vObjs->nSize <= iVar6)) goto LAB_004b4ca7;
          plVar1 = (long *)pNtk->vObjs->pArray[iVar6];
          if ((plVar1 != (long *)0x0) &&
             (((int)plVar1[8] != 2 && (0 < *(int *)((long)plVar1 + 0x1c))))) {
            lVar8 = 0;
            do {
              lVar12 = *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)(plVar1[4] + lVar8 * 4) * 8);
              if (*(int *)(lVar12 + 0x40) == 2) {
                *(undefined4 *)(lVar12 + 0x40) = 4;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < *(int *)((long)plVar1 + 0x1c));
          }
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < vTfi->nSize);
      }
      vMap->nSize = 0;
      vGates->nSize = 0;
      if (0 < vTfi->nSize) {
        lVar8 = 0;
        do {
          iVar6 = vTfi->pArray[lVar8];
          if (((long)iVar6 < 0) || (pNtk->vObjs->nSize <= iVar6)) goto LAB_004b4ca7;
          pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar6];
          if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).iTemp == 1)) {
            uVar11 = *(uint *)&pAVar3->field_0x14 & 0xf;
            uVar13 = 1;
            if (((uVar11 != 2) && (uVar11 != 5)) &&
               (uVar13 = 0, (int)(*(uint *)&pAVar3->field_0x14 >> 0xc) < iVar14)) {
              uVar13 = (uint)(0 < (pAVar3->vFanins).nSize);
            }
            Sfm_DecAddNode(pAVar3,vMap,vGates,uVar13,0);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vTfi->nSize);
      }
      iVar6 = vMap->nSize;
      if (0 < vTfi->nSize) {
        lVar8 = 0;
        do {
          iVar16 = vTfi->pArray[lVar8];
          if (((long)iVar16 < 0) || (pNtk->vObjs->nSize <= iVar16)) goto LAB_004b4ca7;
          pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar16];
          if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).iTemp - 3U < 2)) {
            Sfm_DecAddNode(pAVar3,vMap,vGates,(uint)((pAVar3->field_6).iTemp == 4),0);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vTfi->nSize);
      }
      if (pMit == (Sfm_Mit_t *)0x0) {
        if (pTim != (Sfm_Tim_t *)0x0) {
          iVar16 = vMap->nSize;
          vTfo->nSize = 0;
          if (0 < vMap->nSize) {
            lVar8 = 0;
            do {
              Vec_IntPush(vTfo,vMap->pArray[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < vMap->nSize);
          }
          iVar6 = Sfm_TimSortArrayByArrival(pTim,vTfo,pPivot->Id);
          vMap->nSize = 0;
          vGates->nSize = 0;
          if (0 < vTfo->nSize) {
            lVar8 = 0;
            do {
              iVar15 = vTfo->pArray[lVar8];
              if (((long)iVar15 < 0) || (pNtk->vObjs->nSize <= iVar15)) goto LAB_004b4ca7;
              pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar15];
              if (pAVar3 != (Abc_Obj_t *)0x0) {
                uVar11 = *(uint *)&pAVar3->field_0x14 & 0xf;
                uVar13 = 1;
                if (((uVar11 != 2) && (uVar11 != 5)) &&
                   ((iVar14 <= (int)(*(uint *)&pAVar3->field_0x14 >> 0xc) ||
                    ((pAVar3->vFanins).nSize < 1)))) {
                  uVar13 = (uint)((pAVar3->field_6).iTemp == 4);
                }
                Sfm_DecAddNode(pAVar3,vMap,vGates,uVar13,0);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < vTfo->nSize);
          }
          if (iVar16 != vMap->nSize) {
            __assert_fail("nOldSize == Vec_IntSize(vMap)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x66b,
                          "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                         );
          }
        }
      }
      else {
        iVar16 = vMap->nSize;
        vTfo->nSize = 0;
        if (0 < vMap->nSize) {
          lVar8 = 0;
          do {
            Vec_IntPush(vTfo,vMap->pArray[lVar8]);
            lVar8 = lVar8 + 1;
          } while (lVar8 < vMap->nSize);
        }
        iVar6 = Sfm_MitSortArrayByArrival(pMit,vTfo,pPivot->Id);
        vMap->nSize = 0;
        vGates->nSize = 0;
        if (0 < vTfo->nSize) {
          lVar8 = 0;
          do {
            iVar15 = vTfo->pArray[lVar8];
            if (((long)iVar15 < 0) || (pNtk->vObjs->nSize <= iVar15)) goto LAB_004b4ca7;
            pAVar3 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar15];
            if (pAVar3 != (Abc_Obj_t *)0x0) {
              uVar11 = *(uint *)&pAVar3->field_0x14 & 0xf;
              uVar13 = 1;
              if (((uVar11 != 2) && (uVar11 != 5)) &&
                 ((iVar14 <= (int)(*(uint *)&pAVar3->field_0x14 >> 0xc) ||
                  ((pAVar3->vFanins).nSize < 1)))) {
                uVar13 = (uint)((pAVar3->field_6).iTemp == 4);
              }
              Sfm_DecAddNode(pAVar3,vMap,vGates,uVar13,0);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < vTfo->nSize);
        }
        if (iVar16 != vMap->nSize) {
          __assert_fail("nOldSize == Vec_IntSize(vMap)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                        ,0x65c,
                        "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                       );
        }
      }
      if (0 < vTfi->nSize) {
        lVar8 = 0;
        do {
          iVar14 = vTfi->pArray[lVar8];
          if (((long)iVar14 < 0) || (pNtk->vObjs->nSize <= iVar14)) goto LAB_004b4ca7;
          pvVar2 = pNtk->vObjs->pArray[iVar14];
          if ((pvVar2 != (void *)0x0) && (7 < *(int *)((long)pvVar2 + 0x40))) {
            Vec_IntPush(vMap,*(int *)((long)pvVar2 + 0x10));
            iVar14 = Mio_GateReadValue(*(Mio_Gate_t **)((long)pvVar2 + 0x38));
            Vec_IntPush(vGates,iVar14);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vTfi->nSize);
      }
      if (vMap->nSize != vGates->nSize) {
        __assert_fail("Vec_IntSize(vMap) == Vec_IntSize(vGates)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x675,
                      "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                     );
      }
      iVar14 = vFanins->nSize;
      if (0 < (long)iVar14) {
        pVVar10 = vFanins->pArray;
        lVar8 = 0;
        do {
          *(undefined4 *)((long)&pVVar10->nSize + lVar8) = 0;
          lVar8 = lVar8 + 0x10;
        } while ((long)iVar14 * 0x10 != lVar8);
      }
      vFanins->nSize = 0;
      if (0 < vMap->nSize) {
        lVar8 = 0;
        do {
          iVar14 = vMap->pArray[lVar8];
          if (((long)iVar14 < 0) || (pNtk->vObjs->nSize <= iVar14)) goto LAB_004b4ca7;
          plVar1 = (long *)pNtk->vObjs->pArray[iVar14];
          if (plVar1 != (long *)0x0) {
            *(int *)(plVar1 + 8) = (int)lVar8;
            uVar13 = vFanins->nCap;
            if (vFanins->nSize == uVar13) {
              if ((int)uVar13 < 0x10) {
                if (vFanins->pArray == (Vec_Int_t *)0x0) {
                  pVVar10 = (Vec_Int_t *)malloc(0x100);
                }
                else {
                  pVVar10 = (Vec_Int_t *)realloc(vFanins->pArray,0x100);
                }
                vFanins->pArray = pVVar10;
                iVar14 = 0x10;
              }
              else {
                iVar14 = uVar13 * 2;
                if (iVar14 <= (int)uVar13) goto LAB_004b4ab4;
                if (vFanins->pArray == (Vec_Int_t *)0x0) {
                  pVVar10 = (Vec_Int_t *)malloc((ulong)uVar13 << 5);
                }
                else {
                  pVVar10 = (Vec_Int_t *)realloc(vFanins->pArray,(ulong)uVar13 << 5);
                }
                vFanins->pArray = pVVar10;
              }
              memset(pVVar10 + vFanins->nCap,0,((long)iVar14 - (long)vFanins->nCap) * 0x10);
              vFanins->nCap = iVar14;
            }
LAB_004b4ab4:
            iVar14 = vFanins->nSize;
            uVar13 = iVar14 + 1;
            vFanins->nSize = uVar13;
            if (iVar14 < 0) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                            ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
            }
            if (vGates->nSize <= lVar8) {
LAB_004b4cc6:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if ((-1 < vGates->pArray[lVar8]) && (0 < *(int *)((long)plVar1 + 0x1c))) {
              pVVar10 = vFanins->pArray;
              lVar12 = 0;
              do {
                Vec_IntPush(pVVar10 + ((ulong)uVar13 - 1),
                            *(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                              (long)*(int *)(plVar1[4] + lVar12 * 4) * 8) + 0x40));
                lVar12 = lVar12 + 1;
              } while (lVar12 < *(int *)((long)plVar1 + 0x1c));
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vMap->nSize);
      }
      pAVar4 = pPivot->pNtk;
      if (pAVar4->vPis->nSize < 1) {
LAB_004b4ca7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar1 = *(long **)(**pAVar4->vPis->pArray + 0x158);
      if ((*(int *)(*plVar1 + 0x58) == 0) || ((long)vRoots->nSize < 1)) {
        uVar9 = 0;
      }
      else {
        lVar8 = 0;
        uVar9 = 0;
        do {
          iVar14 = vRoots->pArray[lVar8];
          if (((long)iVar14 < 0) || (pAVar4->vObjs->nSize <= iVar14)) goto LAB_004b4ca7;
          pvVar2 = pAVar4->vObjs->pArray[iVar14];
          if (pvVar2 != (void *)0x0) {
            iVar14 = *(int *)((long)pvVar2 + 0x10);
            lVar12 = (long)iVar14;
            if (((lVar12 < 0) || (*(int *)((long)plVar1 + 0x144) <= iVar14)) ||
               (*(int *)((long)plVar1 + 0x154) <= iVar14)) goto LAB_004b4ce5;
            uVar9 = uVar9 | *(ulong *)(plVar1[0x2b] + lVar12 * 8) ^
                            *(ulong *)(plVar1[0x29] + lVar12 * 8);
          }
          lVar8 = lVar8 + 1;
        } while (vRoots->nSize != lVar8);
      }
      *(ulong *)((long)pAVar4->pData + 200) = uVar9;
      if (0 < vRoots->nSize) {
        piVar7 = vRoots->pArray;
        pVVar5 = pNtk->vObjs;
        lVar8 = 0;
        do {
          iVar14 = piVar7[lVar8];
          if (((long)iVar14 < 0) || (pVVar5->nSize <= iVar14)) goto LAB_004b4ca7;
          pvVar2 = pVVar5->pArray[iVar14];
          if (pvVar2 != (void *)0x0) {
            piVar7[lVar8] = *(int *)((long)pvVar2 + 0x40);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vRoots->nSize);
      }
      if (0 < vInMffc->nSize) {
        piVar7 = vInMffc->pArray;
        pVVar5 = pNtk->vObjs;
        lVar8 = 0;
        do {
          iVar14 = piVar7[lVar8];
          if (((long)iVar14 < 0) || (pVVar5->nSize <= iVar14)) goto LAB_004b4ca7;
          pvVar2 = pVVar5->pArray[iVar14];
          if (pvVar2 != (void *)0x0) {
            piVar7[lVar8] = *(int *)((long)pvVar2 + 0x40);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vInMffc->nSize);
      }
      return iVar6;
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Sfm_DecExtract( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars, Abc_Obj_t * pPivot, Vec_Int_t * vRoots, Vec_Int_t * vGates, Vec_Wec_t * vFanins, Vec_Int_t * vMap, Vec_Int_t * vTfi, Vec_Int_t * vTfo, Vec_Int_t * vMffc, Vec_Int_t * vInMffc, Sfm_Tim_t * pTim, Sfm_Mit_t * pMit )
{
    int fVeryVerbose = 0;//pPars->fVeryVerbose;
    Vec_Int_t * vLevel;
    Abc_Obj_t * pObj, * pFanin;
    int nLevelMax = pPivot->Level + pPars->nTfoLevMax;
    int nLevelMin = pPivot->Level - pPars->nTfiLevMax;
    int i, k, nTfiSize, nDivs = -1;
    assert( Abc_ObjIsNode(pPivot) );
if ( fVeryVerbose )
printf( "\n\nTarget %d\n", Abc_ObjId(pPivot) );
    // collect TFO nodes
    Vec_IntClear( vTfo );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkDfsReverseOne_rec( pPivot, vTfo, nLevelMax, pPars->nFanoutMax );
    // count internal fanouts
    Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pFanin->iTemp++;
    // compute roots
    Vec_IntClear( vRoots );
    Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
        if ( pObj->iTemp != Abc_ObjFanoutNum(pObj) )
            Vec_IntPush( vRoots, Abc_ObjId(pObj) );
    assert( Vec_IntSize(vRoots) > 0 );
    // collect TFI and mark nodes
    Vec_IntClear( vTfi );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkDfsOne_rec( pPivot, vTfi, nLevelMin, SFM_MASK_PI );
    nTfiSize = Vec_IntSize(vTfi);
    Sfm_ObjFlipNode( pPivot );
    // additinally mark MFFC
    Sfm_DecMarkMffc( pPivot, nLevelMin, pPars->nMffcMax, fVeryVerbose, vMffc, vInMffc, pTim, pMit );
    assert( Vec_IntSize(vMffc) <= pPars->nMffcMax );
if ( fVeryVerbose )
printf( "Mffc size = %d. Mffc area = %.2f. InMffc size = %d.\n", Vec_IntSize(vMffc), Sfm_DecMffcArea(pNtk, vMffc)*MIO_NUMINV, Vec_IntSize(vInMffc) );
    // collect TFI(TFO)
    Abc_NtkForEachObjVec( vRoots, pNtk, pObj, i )
        Abc_NtkDfsOne_rec( pObj, vTfi, nLevelMin, SFM_MASK_INPUT );
    // mark input-only nodes pointed to by mixed nodes
    Abc_NtkForEachObjVecStart( vTfi, pNtk, pObj, i, nTfiSize )
        if ( pObj->iTemp != SFM_MASK_INPUT )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( pFanin->iTemp == SFM_MASK_INPUT )
                    pFanin->iTemp = SFM_MASK_FANIN;
    // collect nodes supported only on TFI fanins and not MFFC
if ( fVeryVerbose )
printf( "\nDivs:\n" );
    Vec_IntClear( vMap );
    Vec_IntClear( vGates );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp == SFM_MASK_PI )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0), fVeryVerbose );
    nDivs = Vec_IntSize(vMap);
    // add other nodes that are not in TFO and not in MFFC
if ( fVeryVerbose )
printf( "\nSides:\n" );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp == (SFM_MASK_PI | SFM_MASK_INPUT) || pObj->iTemp == SFM_MASK_FANIN )
            Sfm_DecAddNode( pObj, vMap, vGates, pObj->iTemp == SFM_MASK_FANIN, fVeryVerbose );
    // reorder nodes acording to delay
    if ( pMit )
    {
        int nDivsNew, nOldSize = Vec_IntSize(vMap);
        Vec_IntClear( vTfo );
        Vec_IntAppend( vTfo, vMap );
        nDivsNew = Sfm_MitSortArrayByArrival( pMit, vTfo, Abc_ObjId(pPivot) );
        // collect again
        Vec_IntClear( vMap );
        Vec_IntClear( vGates );
        Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) || pObj->iTemp == SFM_MASK_FANIN, 0 );
        assert( nOldSize == Vec_IntSize(vMap) );
        // update divisor count
        nDivs = nDivsNew;
    }
    else if ( pTim )
    {
        int nDivsNew, nOldSize = Vec_IntSize(vMap);
        Vec_IntClear( vTfo );
        Vec_IntAppend( vTfo, vMap );
        nDivsNew = Sfm_TimSortArrayByArrival( pTim, vTfo, Abc_ObjId(pPivot) );
        // collect again
        Vec_IntClear( vMap );
        Vec_IntClear( vGates );
        Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) || pObj->iTemp == SFM_MASK_FANIN, 0 );
        assert( nOldSize == Vec_IntSize(vMap) );
        // update divisor count
        nDivs = nDivsNew;
    }
    // add the TFO nodes
if ( fVeryVerbose )
printf( "\nTFO:\n" );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp >= SFM_MASK_MFFC )
            Sfm_DecAddNode( pObj, vMap, vGates, 0, fVeryVerbose );
    assert( Vec_IntSize(vMap) == Vec_IntSize(vGates) );
if ( fVeryVerbose )
printf( "\n" );
    // create node IDs
    Vec_WecClear( vFanins );
    Abc_NtkForEachObjVec( vMap, pNtk, pObj, i )
    {
        pObj->iTemp = i;
        vLevel = Vec_WecPushLevel( vFanins );
        if ( Vec_IntEntry(vGates, i) >= 0 )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Vec_IntPush( vLevel, pFanin->iTemp );
    }
    // compute care set
    Sfm_DecMan(pPivot)->uCareSet = Sfm_ObjFindCareSet(pPivot->pNtk, vRoots);

    //printf( "care = %5d : ", Abc_ObjId(pPivot) );
    //Extra_PrintBinary( stdout, (unsigned *)&Sfm_DecMan(pPivot)->uCareSet, 64 );
    //printf( "\n" );

    // remap roots
    Abc_NtkForEachObjVec( vRoots, pNtk, pObj, i )
        Vec_IntWriteEntry( vRoots, i, pObj->iTemp );
    // remap inputs to MFFC
    Abc_NtkForEachObjVec( vInMffc, pNtk, pObj, i )
        Vec_IntWriteEntry( vInMffc, i, pObj->iTemp );

/*
    // check
    Abc_NtkForEachObjVec( vMap, pNtk, pObj, i )
    {
        if ( i == nDivs )
            break;
        Abc_NtkIncrementTravId( pNtk );
        assert( Abc_NtkDfsCheck_rec(pObj, pPivot) );
    }
*/  
    return nDivs;
}